

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::teximage3d_max_width_height_depth
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  int local_18;
  int local_14;
  int maxTextureSize;
  int max3DTextureSize;
  NegativeTestContext *ctx_local;
  
  _maxTextureSize = ctx;
  local_14 = NegativeTestContext::getInteger(ctx,0x8073);
  local_14 = local_14 + 1;
  local_18 = NegativeTestContext::getInteger(_maxTextureSize,0xd33);
  pNVar1 = _maxTextureSize;
  local_18 = local_18 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if width, height or depth is greater than GL_MAX_3D_TEXTURE_SIZE."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glTexImage3D
            (&_maxTextureSize->super_CallLogWrapper,0x806f,0,0x1908,local_14,1,1,0,0x1908,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxTextureSize,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&_maxTextureSize->super_CallLogWrapper,0x806f,0,0x1908,1,local_14,1,0,0x1908,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxTextureSize,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&_maxTextureSize->super_CallLogWrapper,0x806f,0,0x1908,1,1,local_14,0,0x1908,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxTextureSize,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&_maxTextureSize->super_CallLogWrapper,0x806f,0,0x1908,local_14,local_14,local_14,0,
             0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(_maxTextureSize,0x501);
  NegativeTestContext::endSection(_maxTextureSize);
  pNVar1 = _maxTextureSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_VALUE is generated if width, height or depth is greater than GL_MAX_TEXTURE_SIZE."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glTexImage3D
            (&_maxTextureSize->super_CallLogWrapper,0x8c1a,0,0x1908,local_18,1,1,0,0x1908,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxTextureSize,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&_maxTextureSize->super_CallLogWrapper,0x8c1a,0,0x1908,1,local_18,1,0,0x1908,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxTextureSize,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&_maxTextureSize->super_CallLogWrapper,0x8c1a,0,0x1908,1,1,local_18,0,0x1908,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxTextureSize,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&_maxTextureSize->super_CallLogWrapper,0x8c1a,0,0x1908,local_18,local_18,local_18,0,
             0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(_maxTextureSize,0x501);
  NegativeTestContext::endSection(_maxTextureSize);
  return;
}

Assistant:

void teximage3d_max_width_height_depth (NegativeTestContext& ctx)
{
	int max3DTextureSize	= ctx.getInteger(GL_MAX_3D_TEXTURE_SIZE) + 1;
	int maxTextureSize		= ctx.getInteger(GL_MAX_TEXTURE_SIZE) + 1;

	ctx.beginSection("GL_INVALID_VALUE is generated if width, height or depth is greater than GL_MAX_3D_TEXTURE_SIZE.");
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, max3DTextureSize, 1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, 1, max3DTextureSize, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, 1, 1, max3DTextureSize, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, max3DTextureSize, max3DTextureSize, max3DTextureSize, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if width, height or depth is greater than GL_MAX_TEXTURE_SIZE.");
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, maxTextureSize, 1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 1, maxTextureSize, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 1, 1, maxTextureSize, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, maxTextureSize, maxTextureSize, maxTextureSize, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}